

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O0

REF_STATUS ref_gather_node_bamg_met(REF_GRID ref_grid,FILE *file)

{
  undefined4 uVar1;
  long lVar2;
  uint uVar3;
  double local_a0;
  int local_98;
  int local_90;
  int local_8c;
  int local_88;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_STATUS ref_private_macro_code_rxs;
  REF_STATUS status;
  REF_INT im;
  REF_INT i;
  REF_INT n;
  REF_INT local;
  REF_GLOB first;
  REF_GLOB nnode_written;
  REF_GLOB global;
  REF_DBL *xyzm;
  REF_DBL *local_xyzm;
  REF_MPI pRStack_30;
  REF_INT chunk;
  REF_MPI ref_mpi;
  REF_NODE ref_node;
  FILE *file_local;
  REF_GRID ref_grid_local;
  
  ref_mpi = (REF_MPI)ref_grid->node;
  pRStack_30 = ref_grid->mpi;
  ref_node = (REF_NODE)file;
  file_local = (FILE *)ref_grid;
  if (ref_grid->twod == 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x541,
           "ref_gather_node_bamg_met","only implemented for twod mesh");
    ref_grid_local._4_4_ = 1;
  }
  else {
    if (pRStack_30->id == 0) {
      fprintf((FILE *)file,"%ld %d\n",((REF_NODE)ref_mpi)->old_n_global,3);
    }
    local_8c = (int)(*(long *)&ref_mpi[1].timing / (long)pRStack_30->n) + 1;
    if (pRStack_30->reduce_byte_limit < 1) {
      local_88 = 0x7fffffff;
    }
    else {
      local_88 = pRStack_30->reduce_byte_limit / 0x38;
    }
    if (local_88 <= local_8c) {
      if (pRStack_30->reduce_byte_limit < 1) {
        local_90 = 0x7fffffff;
      }
      else {
        local_90 = pRStack_30->reduce_byte_limit / 0x38;
      }
      local_8c = local_90;
    }
    local_xyzm._4_4_ = local_8c;
    if (local_8c * 7 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x54b,"ref_gather_node_bamg_met","malloc local_xyzm of REF_DBL negative");
      ref_grid_local._4_4_ = 1;
    }
    else {
      xyzm = (REF_DBL *)malloc((long)(local_8c * 7) << 3);
      if (xyzm == (REF_DBL *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x54b,"ref_gather_node_bamg_met","malloc local_xyzm of REF_DBL NULL");
        ref_grid_local._4_4_ = 2;
      }
      else if (local_xyzm._4_4_ * 7 < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x54c,"ref_gather_node_bamg_met","malloc xyzm of REF_DBL negative");
        ref_grid_local._4_4_ = 1;
      }
      else {
        global = (REF_GLOB)malloc((long)(local_xyzm._4_4_ * 7) << 3);
        if ((void *)global == (void *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x54c,"ref_gather_node_bamg_met","malloc xyzm of REF_DBL NULL");
          ref_grid_local._4_4_ = 2;
        }
        else {
          first = 0;
          while (lVar2._0_4_ = ref_mpi[1].timing, lVar2._4_4_ = ref_mpi[1].reduce_byte_limit,
                first < lVar2) {
            _n = first;
            if ((long)local_xyzm._4_4_ < *(long *)&ref_mpi[1].timing - first) {
              local_98 = local_xyzm._4_4_;
            }
            else {
              uVar1 = ref_mpi[1].timing;
              local_98 = uVar1 - (int)first;
            }
            first = local_98 + first;
            for (status = 0;
                SBORROW4(status,local_xyzm._4_4_ * 7) != status + local_xyzm._4_4_ * -7 < 0;
                status = status + 1) {
              xyzm[status] = 0.0;
            }
            for (status = 0; status < local_98; status = status + 1) {
              nnode_written = _n + status;
              uVar3 = ref_node_local((REF_NODE)ref_mpi,nnode_written,&i);
              if ((uVar3 != 0) && (uVar3 != 5)) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0x55b,"ref_gather_node_bamg_met",(ulong)uVar3,"node local failed");
                return uVar3;
              }
              if ((uVar3 == 0) &&
                 (pRStack_30->id == *(int *)(*(long *)&ref_mpi->native_alltoallv + (long)i * 4))) {
                uVar3 = ref_node_metric_get((REF_NODE)ref_mpi,i,xyzm + status * 7);
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0x55e,"ref_gather_node_bamg_met",(ulong)uVar3,"get");
                  return uVar3;
                }
                xyzm[status * 7 + 6] = 1.0;
              }
              else {
                for (ref_private_macro_code_rxs = 0; ref_private_macro_code_rxs < 7;
                    ref_private_macro_code_rxs = ref_private_macro_code_rxs + 1) {
                  xyzm[ref_private_macro_code_rxs + status * 7] = 0.0;
                }
              }
            }
            uVar3 = ref_mpi_sum(pRStack_30,xyzm,(void *)global,local_98 * 7,3);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x565,"ref_gather_node_bamg_met",(ulong)uVar3,"sum");
              return uVar3;
            }
            if (pRStack_30->id == 0) {
              for (status = 0; status < local_98; status = status + 1) {
                if (*(double *)(global + (long)(status * 7 + 6) * 8) - 1.0 <= 0.0) {
                  local_a0 = -(*(double *)(global + (long)(status * 7 + 6) * 8) - 1.0);
                }
                else {
                  local_a0 = *(double *)(global + (long)(status * 7 + 6) * 8) - 1.0;
                }
                if (0.1 < local_a0) {
                  printf("error gather node %ld %f\n",
                         *(undefined8 *)(global + (long)(status * 7 + 6) * 8),_n + status);
                }
                fprintf((FILE *)ref_node,"%.15e %.15e %.15e\n",
                        *(undefined8 *)(global + (long)(status * 7) * 8),
                        *(undefined8 *)(global + (long)(status * 7 + 1) * 8),
                        *(undefined8 *)(global + (long)(status * 7 + 3) * 8));
              }
            }
          }
          if (global != 0) {
            free((void *)global);
          }
          if (xyzm != (REF_DBL *)0x0) {
            free(xyzm);
          }
          ref_grid_local._4_4_ = 0;
        }
      }
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_node_bamg_met(REF_GRID ref_grid,
                                                   FILE *file) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_INT chunk;
  REF_DBL *local_xyzm, *xyzm;
  REF_GLOB global, nnode_written, first;
  REF_INT local, n, i, im;
  REF_STATUS status;

  RAS(ref_grid_twod(ref_grid), "only implemented for twod mesh");

  if (ref_mpi_once(ref_mpi)) {
    fprintf(file, "%ld %d\n", (long)ref_node_n_global(ref_node), 3);
  }

  chunk = (REF_INT)(ref_node_n_global(ref_node) / ref_mpi_n(ref_mpi) + 1);
  chunk = MIN(
      chunk, ref_mpi_reduce_chunk_limit(ref_mpi, 7 * (REF_INT)sizeof(REF_DBL)));

  ref_malloc(local_xyzm, 7 * chunk, REF_DBL);
  ref_malloc(xyzm, 7 * chunk, REF_DBL);

  nnode_written = 0;
  while (nnode_written < ref_node_n_global(ref_node)) {
    first = nnode_written;
    n = (REF_INT)MIN((REF_GLOB)chunk,
                     ref_node_n_global(ref_node) - nnode_written);

    nnode_written += n;

    for (i = 0; i < 7 * chunk; i++) local_xyzm[i] = 0.0;

    for (i = 0; i < n; i++) {
      global = first + i;
      status = ref_node_local(ref_node, global, &local);
      RXS(status, REF_NOT_FOUND, "node local failed");
      if (REF_SUCCESS == status &&
          ref_mpi_rank(ref_mpi) == ref_node_part(ref_node, local)) {
        RSS(ref_node_metric_get(ref_node, local, &(local_xyzm[7 * i])), "get");
        local_xyzm[6 + 7 * i] = 1.0;
      } else {
        for (im = 0; im < 7; im++) local_xyzm[im + 7 * i] = 0.0;
      }
    }

    RSS(ref_mpi_sum(ref_mpi, local_xyzm, xyzm, 7 * n, REF_DBL_TYPE), "sum");

    if (ref_mpi_once(ref_mpi))
      for (i = 0; i < n; i++) {
        if (ABS(xyzm[6 + 7 * i] - 1.0) > 0.1) {
          printf("error gather node " REF_GLOB_FMT " %f\n", first + i,
                 xyzm[6 + 7 * i]);
        }
        fprintf(file, "%.15e %.15e %.15e\n", xyzm[0 + 7 * i], xyzm[1 + 7 * i],
                xyzm[3 + 7 * i]);
      }
  }

  ref_free(xyzm);
  ref_free(local_xyzm);

  return REF_SUCCESS;
}